

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetTracerExpSetEpilogues(zet_tracer_exp_handle_t hTracer,zet_core_callbacks_t *pCoreCbs)

{
  zet_pfnTracerExpSetEpilogues_t pfnSetEpilogues;
  dditable_t *dditable;
  ze_result_t result;
  zet_core_callbacks_t *pCoreCbs_local;
  zet_tracer_exp_handle_t hTracer_local;
  
  if (*(code **)(*(long *)(hTracer + 8) + 0x810) == (code *)0x0) {
    hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hTracer_local._4_4_ =
         (**(code **)(*(long *)(hTracer + 8) + 0x810))(*(undefined8 *)hTracer,pCoreCbs);
  }
  return hTracer_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetTracerExpSetEpilogues(
        zet_tracer_exp_handle_t hTracer,                ///< [in] handle of the tracer
        zet_core_callbacks_t* pCoreCbs                  ///< [in] pointer to table of 'core' callback function pointers
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_tracer_exp_object_t*>( hTracer )->dditable;
        auto pfnSetEpilogues = dditable->zet.TracerExp.pfnSetEpilogues;
        if( nullptr == pfnSetEpilogues )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hTracer = reinterpret_cast<zet_tracer_exp_object_t*>( hTracer )->handle;

        // forward to device-driver
        result = pfnSetEpilogues( hTracer, pCoreCbs );

        return result;
    }